

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_array.h
# Opt level: O0

void __thiscall
absl::lts_20240722::
FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::Storage::~Storage
          (Storage *this)

{
  bool bVar1;
  size_type sVar2;
  allocator_type *__a;
  StorageElement *ptr;
  pointer __p;
  Storage *this_local;
  
  sVar2 = size(this);
  bVar1 = UsingInlinedStorage(sVar2);
  if (bVar1) {
    sVar2 = size(this);
    NonEmptyInlinedStorage::AnnotateDestruct(&this->super_InlinedStorage,sVar2);
  }
  else {
    __a = alloc(this);
    ptr = begin(this);
    __p = AsValueType(ptr);
    sVar2 = size(this);
    std::allocator_traits<std::allocator<unsigned_long>_>::deallocate(__a,__p,sVar2);
  }
  container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>::
  ~CompressedTuple(&this->size_alloc_);
  return;
}

Assistant:

~Storage() noexcept {
      if (UsingInlinedStorage(size())) {
        InlinedStorage::AnnotateDestruct(size());
      } else {
        AllocatorTraits::deallocate(alloc(), AsValueType(begin()), size());
      }
    }